

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O1

void Unr_ManProfileRanks(Vec_Int_t *vRanks)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  void *__s;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  
  uVar2 = vRanks->nSize;
  if ((ulong)uVar2 == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = *vRanks->pArray;
    if (1 < (int)uVar2) {
      uVar7 = 1;
      do {
        uVar6 = vRanks->pArray[uVar7];
        if ((int)uVar9 <= (int)uVar6) {
          uVar9 = uVar6;
        }
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
  }
  uVar2 = uVar9 + 1;
  uVar6 = 0x10;
  if (0xe < uVar9) {
    uVar6 = uVar2;
  }
  if (uVar6 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar6 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)(int)uVar2 << 2);
  }
  iVar3 = vRanks->nSize;
  if (0 < (long)iVar3) {
    piVar5 = vRanks->pArray;
    lVar8 = 0;
    do {
      iVar4 = piVar5[lVar8];
      if (((long)iVar4 < 0) || ((int)uVar9 < iVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = (int *)((long)__s + (long)iVar4 * 4);
      *piVar1 = *piVar1 + 1;
      lVar8 = lVar8 + 1;
    } while (iVar3 != lVar8);
  }
  if ((int)uVar9 < 0) {
    uVar9 = 0;
  }
  else {
    uVar7 = 0;
    uVar9 = 0;
    do {
      uVar6 = *(uint *)((long)__s + uVar7 * 4);
      if (uVar6 != 0) {
        printf("%2d : %8d  (%6.2f %%)\n",((double)(int)uVar6 * 100.0) / (double)vRanks->nSize,
               uVar7 & 0xffffffff,(ulong)uVar6);
        uVar9 = uVar9 + uVar6 * (int)uVar7;
      }
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  printf("Extra space = %d (%6.2f %%)  ",((double)(int)uVar9 * 100.0) / (double)vRanks->nSize,
         (ulong)uVar9);
  if (__s == (void *)0x0) {
    return;
  }
  free(__s);
  return;
}

Assistant:

void Unr_ManProfileRanks( Vec_Int_t * vRanks )
{
    int RankMax = Vec_IntFindMax( vRanks );
    Vec_Int_t * vCounts = Vec_IntStart( RankMax+1 );
    int i, Rank, Count, nExtras = 0;
    Vec_IntForEachEntry( vRanks, Rank, i )
        Vec_IntAddToEntry( vCounts, Rank, 1 );
    Vec_IntForEachEntry( vCounts, Count, i )
    {
        if ( Count == 0 )
            continue;
        printf( "%2d : %8d  (%6.2f %%)\n", i, Count, 100.0 * Count / Vec_IntSize(vRanks) );
        nExtras += Count * i;
    }
    printf( "Extra space = %d (%6.2f %%)  ", nExtras, 100.0 * nExtras / Vec_IntSize(vRanks) );
    Vec_IntFree( vCounts );
}